

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDebugLoclists::Entry::dump
          (Entry *this,raw_ostream *OS,uint64_t *BaseAddr,bool IsLittleEndian,uint AddressSize,
          MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent,
          size_t MaxEncodingStringLength)

{
  uint64_t uVar1;
  byte bVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  SmallVectorImpl<unsigned_char> *pSVar6;
  raw_ostream *prVar7;
  undefined7 in_register_00000009;
  char *pcVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  size_t sVar9;
  undefined1 auVar10 [16];
  StringRef SVar11;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  ArrayRef<unsigned_char> Data;
  DWARFAddressRange local_78;
  undefined8 local_60;
  char *local_58;
  int local_50;
  int local_4c;
  MCRegisterInfo *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,IsLittleEndian);
  local_40 = MRI;
  if (DumpOpts.Verbose == true) {
    SVar11.Length = 1;
    SVar11.Data = "\n";
    raw_ostream::operator<<(OS,SVar11);
    raw_ostream::indent(OS,Indent);
    SVar11 = dwarf::LocListEncodingString((uint)this->Kind);
    local_58 = SVar11.Data;
    if (SVar11.Length == 0) {
      __assert_fail("!EncodingString.empty() && \"Unknown loclist entry encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLoc.cpp"
                    ,0xf2,
                    "void llvm::DWARFDebugLoclists::Entry::dump(raw_ostream &, uint64_t &, bool, unsigned int, const MCRegisterInfo *, DWARFUnit *, DIDumpOptions, unsigned int, size_t) const"
                   );
    }
    pcVar8 = (char *)((MaxEncodingStringLength - SVar11.Length) + 1);
    local_78.HighPC = 0xbcc096;
    local_78.LowPC = (uint64_t)&PTR_home_00d77ec0;
    local_78.SectionIndex = CONCAT71(local_78.SectionIndex._1_7_,0x28);
    local_60 = pcVar8;
    raw_ostream::operator<<(OS,(format_object_base *)&local_78);
    bVar2 = this->Kind;
    __buf = extraout_RDX;
    if (bVar2 < 9) {
      if ((0x118U >> (bVar2 & 0x1f) & 1) == 0) {
        pcVar8 = (char *)0x42;
        if ((0x42U >> (bVar2 & 0x1f) & 1) == 0) goto LAB_00af5447;
        local_78.HighPC = 0xbcb5fe;
        local_78.LowPC = (uint64_t)&PTR_home_00d778d8;
        pcVar8 = (char *)this->Value0;
        local_60 = (char *)CONCAT44(AddressSize * 2,AddressSize * 2);
        local_78.SectionIndex = (uint64_t)pcVar8;
      }
      else {
        local_50 = AddressSize * 2;
        local_78.HighPC = 0xbcb5f4;
        local_78.LowPC = (uint64_t)&PTR_home_00d77ee0;
        local_60 = (char *)CONCAT44(local_50,local_50);
        pcVar8 = (char *)this->Value0;
        local_78.SectionIndex = (uint64_t)this->Value1;
        local_58 = pcVar8;
        local_4c = local_50;
      }
      raw_ostream::operator<<(OS,(format_object_base *)&local_78);
      __buf = extraout_RDX_00;
    }
LAB_00af5447:
    pcVar3 = OS->OutBufCur;
    if (pcVar3 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar3 + 1;
      *pcVar3 = ')';
    }
    else {
      raw_ostream::write(OS,0x29,__buf,(size_t)pcVar8);
    }
  }
  switch(this->Kind) {
  case '\0':
  case '\x01':
    break;
  default:
    llvm_unreachable_internal
              ("unreachable locations list kind",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLoc.cpp"
               ,300);
  case '\x03':
    if (OS->OutBufEnd == OS->OutBufCur) {
      raw_ostream::write(OS,0xba6bdf,&DAT_00000001,0xbcb458);
    }
    else {
      *OS->OutBufCur = '\n';
      OS->OutBufCur = OS->OutBufCur + 1;
    }
    raw_ostream::indent(OS,Indent);
    if (DumpOpts.Verbose != false) {
      local_78.HighPC = 0xbcb77b;
      local_78.LowPC = (uint64_t)&PTR_home_00d77b68;
      local_78.SectionIndex = 0xb763fd;
      local_60 = (char *)MaxEncodingStringLength;
      raw_ostream::operator<<(OS,(format_object_base *)&local_78);
    }
    Str.Length = 9;
    Str.Data = "Addr idx ";
    prVar7 = raw_ostream::operator<<(OS,Str);
    prVar7 = raw_ostream::operator<<(prVar7,this->Value0);
    Str_00.Length = 0xc;
    Str_00.Data = " (w/ length ";
    prVar7 = raw_ostream::operator<<(prVar7,Str_00);
    prVar7 = raw_ostream::operator<<(prVar7,this->Value1);
    pcVar8 = "): ";
    sVar9 = 3;
    goto LAB_00af56df;
  case '\x04':
    if (OS->OutBufEnd == OS->OutBufCur) {
      raw_ostream::write(OS,0xba6bdf,&DAT_00000001,0xbcb458);
    }
    else {
      *OS->OutBufCur = '\n';
      OS->OutBufCur = OS->OutBufCur + 1;
    }
    raw_ostream::indent(OS,Indent);
    if (DumpOpts.Verbose != false) {
      local_78.HighPC = 0xbcb77b;
      local_78.LowPC = (uint64_t)&PTR_home_00d77b68;
      local_78.SectionIndex = 0xb763fd;
      local_60 = (char *)MaxEncodingStringLength;
      raw_ostream::operator<<(OS,(format_object_base *)&local_78);
    }
    uVar1 = *BaseAddr;
    auVar10._8_4_ = (int)uVar1;
    auVar10._0_8_ = uVar1;
    auVar10._12_4_ = (int)(uVar1 >> 0x20);
    local_78.LowPC = uVar1 + this->Value0;
    local_78.HighPC = auVar10._8_8_ + this->Value1;
    goto LAB_00af56c1;
  case '\x06':
    *BaseAddr = this->Value0;
    break;
  case '\b':
    if (OS->OutBufEnd == OS->OutBufCur) {
      raw_ostream::write(OS,0xba6bdf,&DAT_00000001,0xbcb458);
    }
    else {
      *OS->OutBufCur = '\n';
      OS->OutBufCur = OS->OutBufCur + 1;
    }
    raw_ostream::indent(OS,Indent);
    if (DumpOpts.Verbose != false) {
      local_78.HighPC = 0xbcb77b;
      local_78.LowPC = (uint64_t)&PTR_home_00d77b68;
      local_78.SectionIndex = 0xb763fd;
      local_60 = (char *)MaxEncodingStringLength;
      raw_ostream::operator<<(OS,(format_object_base *)&local_78);
    }
    local_78.LowPC = this->Value0;
    local_78.HighPC = this->Value1 + local_78.LowPC;
LAB_00af56c1:
    local_78.SectionIndex = 0;
    DWARFAddressRange::dump(&local_78,OS,AddressSize,DumpOpts);
    pcVar8 = ": ";
    sVar9 = 2;
    prVar7 = OS;
LAB_00af56df:
    Str_01.Length = sVar9;
    Str_01.Data = pcVar8;
    raw_ostream::operator<<(prVar7,Str_01);
    goto LAB_00af56e4;
  }
  if (DumpOpts.Verbose != false) {
LAB_00af56e4:
    pSVar6 = &(this->Loc).super_SmallVectorImpl<unsigned_char>;
    uVar4 = (pSVar6->super_SmallVectorTemplateBase<unsigned_char,_true>).
            super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    uVar5 = (pSVar6->super_SmallVectorTemplateBase<unsigned_char,_true>).
            super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    Data.Length._0_4_ = uVar5;
    Data.Data = (uchar *)uVar4;
    Data.Length._4_4_ = 0;
    dumpExpression(OS,Data,local_34._0_1_,AddressSize,local_40,U);
  }
  return;
}

Assistant:

void DWARFDebugLoclists::Entry::dump(raw_ostream &OS, uint64_t &BaseAddr,
                                     bool IsLittleEndian, unsigned AddressSize,
                                     const MCRegisterInfo *MRI, DWARFUnit *U,
                                     DIDumpOptions DumpOpts, unsigned Indent,
                                     size_t MaxEncodingStringLength) const {
  if (DumpOpts.Verbose) {
    OS << "\n";
    OS.indent(Indent);
    auto EncodingString = dwarf::LocListEncodingString(Kind);
    // Unsupported encodings should have been reported during parsing.
    assert(!EncodingString.empty() && "Unknown loclist entry encoding");
    OS << format("%s%*c", EncodingString.data(),
                 MaxEncodingStringLength - EncodingString.size() + 1, '(');
    switch (Kind) {
    case dwarf::DW_LLE_startx_length:
    case dwarf::DW_LLE_start_length:
    case dwarf::DW_LLE_offset_pair:
      OS << format("0x%*.*" PRIx64 ", 0x%*.*" PRIx64, AddressSize * 2,
                 AddressSize * 2, Value0, AddressSize * 2, AddressSize * 2,
                 Value1);
      break;
    case dwarf::DW_LLE_base_addressx:
    case dwarf::DW_LLE_base_address:
      OS << format("0x%*.*" PRIx64, AddressSize * 2, AddressSize * 2,
                   Value0);
      break;
    case dwarf::DW_LLE_end_of_list:
      break;
    }
    OS << ')';
  }
  auto PrintPrefix = [&] {
    OS << "\n";
    OS.indent(Indent);
    if (DumpOpts.Verbose)
      OS << format("%*s", MaxEncodingStringLength, (const char *)"=> ");
  };
  switch (Kind) {
  case dwarf::DW_LLE_startx_length:
    PrintPrefix();
    OS << "Addr idx " << Value0 << " (w/ length " << Value1 << "): ";
    break;
  case dwarf::DW_LLE_start_length:
    PrintPrefix();
    DWARFAddressRange(Value0, Value0 + Value1)
        .dump(OS, AddressSize, DumpOpts);
    OS << ": ";
    break;
  case dwarf::DW_LLE_offset_pair:
    PrintPrefix();
    DWARFAddressRange(BaseAddr + Value0, BaseAddr + Value1)
        .dump(OS, AddressSize, DumpOpts);
    OS << ": ";
    break;
  case dwarf::DW_LLE_base_addressx:
    if (!DumpOpts.Verbose)
      return;
    break;
  case dwarf::DW_LLE_end_of_list:
    if (!DumpOpts.Verbose)
      return;
    break;
  case dwarf::DW_LLE_base_address:
    BaseAddr = Value0;
    if (!DumpOpts.Verbose)
      return;
    break;
  default:
    llvm_unreachable("unreachable locations list kind");
  }

  dumpExpression(OS, Loc, IsLittleEndian, AddressSize, MRI, U);
}